

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

void green_poller_swap(green_poller_t poller,int lhs,int rhs)

{
  green_future_t *ppgVar1;
  green_future_t pgVar2;
  green_future_t pgVar3;
  char *pcVar4;
  undefined8 uVar5;
  
  fprintf(_stderr,"swapping %d and %d.\n",lhs,(ulong)(uint)rhs);
  if (lhs == rhs) {
    return;
  }
  green_poller_dump(poller);
  ppgVar1 = poller->futures;
  pgVar2 = ppgVar1[lhs];
  if (pgVar2->slot == lhs) {
    pgVar3 = ppgVar1[rhs];
    if (pgVar3->slot == rhs) {
      ppgVar1[lhs] = pgVar3;
      pgVar3->slot = lhs;
      poller->futures[rhs] = pgVar2;
      pgVar2->slot = rhs;
      green_poller_dump(poller);
      return;
    }
    pcVar4 = "f2->slot == rhs";
    uVar5 = 0x171;
  }
  else {
    pcVar4 = "f1->slot == lhs";
    uVar5 = 0x170;
  }
  fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",pcVar4,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
          ,uVar5);
  fflush(_stderr);
  abort();
}

Assistant:

static void green_poller_swap(green_poller_t poller, int lhs, int rhs)
{
    fprintf(stderr, "swapping %d and %d.\n", lhs, rhs);
    if (lhs == rhs) {
        return;
    }
    green_poller_dump(poller);
    green_future_t f1 = poller->futures[lhs];
    green_future_t f2 = poller->futures[rhs];
    green_assert(f1->slot == lhs);
    green_assert(f2->slot == rhs);
    poller->futures[lhs] = f2, f2->slot = lhs;
    poller->futures[rhs] = f1, f1->slot = rhs;
    green_poller_dump(poller);
}